

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void * WindowSettingsHandler_ReadOpen
                 (ImGuiContext *param_1,ImGuiSettingsHandler *param_2,char *name)

{
  char *pcVar1;
  ImU32 IVar2;
  ImGuiWindowSettings *pIVar3;
  ImU32 *pIVar4;
  ImU32 *pIVar5;
  
  IVar2 = ImHashStr(name,0,0);
  pcVar1 = (GImGui->SettingsWindows).Buf.Data;
  if (pcVar1 != (char *)0x0) {
    pIVar5 = (ImU32 *)(pcVar1 + 4);
    pIVar4 = pIVar5;
    do {
      if (*pIVar4 == IVar2) {
        return pIVar4;
      }
      pIVar4 = (ImU32 *)((long)pIVar4 + (long)(int)pIVar4[-1]);
    } while (pIVar4 != (ImU32 *)((long)(GImGui->SettingsWindows).Buf.Size + (long)pIVar5));
  }
  pIVar3 = ImGui::CreateNewWindowSettings(name);
  return pIVar3;
}

Assistant:

static void* WindowSettingsHandler_ReadOpen(ImGuiContext*, ImGuiSettingsHandler*, const char* name)
{
    ImGuiWindowSettings* settings = ImGui::FindWindowSettings(ImHashStr(name));
    if (!settings)
        settings = ImGui::CreateNewWindowSettings(name);
    return (void*)settings;
}